

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
DepfileParserTestEarlyNewlineAndWhitespace::~DepfileParserTestEarlyNewlineAndWhitespace
          (DepfileParserTestEarlyNewlineAndWhitespace *this)

{
  DepfileParserTestEarlyNewlineAndWhitespace *this_local;
  
  ~DepfileParserTestEarlyNewlineAndWhitespace(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DepfileParserTest, EarlyNewlineAndWhitespace) {
  string err;
  EXPECT_TRUE(Parse(
" \\\n"
"  out: in\n",
      &err));
  ASSERT_EQ("", err);
}